

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int defragmentPage(MemPage *pPage)

{
  ushort uVar1;
  ushort uVar2;
  u32 uVar3;
  u8 *puVar4;
  bool bVar5;
  ushort uVar6;
  u16 uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  u32 uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  u8 *local_78;
  u8 *local_68;
  
  puVar4 = pPage->aData;
  uVar8 = (ulong)pPage->hdrOffset;
  uVar1 = pPage->cellOffset;
  uVar2 = pPage->nCell;
  uVar3 = pPage->pBt->usableSize;
  uVar9 = (uint)uVar1 + (uint)uVar2 * 2;
  uVar11 = uVar3;
  if (uVar2 != 0) {
    uVar10 = 0;
    local_68 = (u8 *)0x0;
    local_78 = puVar4;
    do {
      uVar6 = *(ushort *)(puVar4 + uVar10 * 2 + (ulong)uVar1) << 8 |
              *(ushort *)(puVar4 + uVar10 * 2 + (ulong)uVar1) >> 8;
      if ((uVar6 < uVar9) ||
         (uVar13 = (uint)uVar6, uVar13 != uVar3 - 4 && (int)(uVar3 - 4) <= (int)(uint)uVar6)) {
        sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xd3a8,
                    "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
        bVar5 = true;
      }
      else {
        uVar7 = cellSizePtr(pPage,local_78 + uVar13);
        uVar14 = uVar11 - uVar7;
        if (((int)uVar14 < (int)uVar9) || ((int)uVar3 < (int)((uint)uVar6 + (uint)uVar7))) {
          sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xd3b4,
                      "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
          bVar5 = true;
          uVar11 = uVar14;
        }
        else {
          *(ushort *)(puVar4 + uVar10 * 2 + (ulong)uVar1) =
               (ushort)uVar14 << 8 | (ushort)uVar14 >> 8;
          if (local_68 == (u8 *)0x0) {
            if (uVar14 == uVar13) {
              bVar5 = false;
              local_68 = (u8 *)0x0;
              uVar11 = uVar14;
              goto LAB_0013aa35;
            }
            local_78 = (u8 *)pPage->pBt->pPager->pTmpSpace;
            uVar6 = *(ushort *)(puVar4 + uVar8 + 5) << 8 | *(ushort *)(puVar4 + uVar8 + 5) >> 8;
            memcpy(local_78 + uVar6,puVar4 + uVar6,(long)(int)(uVar11 - uVar6));
            local_68 = local_78;
          }
          memcpy(puVar4 + uVar14,local_78 + uVar13,(ulong)uVar7);
          bVar5 = false;
          uVar11 = uVar14;
        }
      }
LAB_0013aa35:
      if (bVar5) {
        return 0xb;
      }
      uVar10 = uVar10 + 1;
    } while (uVar2 != uVar10);
  }
  *(ushort *)(puVar4 + uVar8 + 5) = (ushort)uVar11 << 8 | (ushort)uVar11 >> 8;
  (puVar4 + uVar8 + 1)[0] = '\0';
  (puVar4 + uVar8 + 1)[1] = '\0';
  puVar4[uVar8 + 7] = '\0';
  iVar12 = 0;
  memset(puVar4 + uVar9,0,(long)(int)(uVar11 - uVar9));
  if (uVar11 - uVar9 != (uint)pPage->nFree) {
    iVar12 = 0xb;
    sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xd3cd,
                "8a8ffc862e96f57aa698f93de10dee28e69f6e09");
  }
  return iVar12;
}

Assistant:

static int defragmentPage(MemPage *pPage){
  int i;                     /* Loop counter */
  int pc;                    /* Address of the i-th cell */
  int hdr;                   /* Offset to the page header */
  int size;                  /* Size of a cell */
  int usableSize;            /* Number of usable bytes on a page */
  int cellOffset;            /* Offset to the cell pointer array */
  int cbrk;                  /* Offset to the cell content area */
  int nCell;                 /* Number of cells on the page */
  unsigned char *data;       /* The page data */
  unsigned char *temp;       /* Temp area for cell content */
  unsigned char *src;        /* Source of content */
  int iCellFirst;            /* First allowable cell index */
  int iCellLast;             /* Last possible cell index */


  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( pPage->pBt!=0 );
  assert( pPage->pBt->usableSize <= SQLITE_MAX_PAGE_SIZE );
  assert( pPage->nOverflow==0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  temp = 0;
  src = data = pPage->aData;
  hdr = pPage->hdrOffset;
  cellOffset = pPage->cellOffset;
  nCell = pPage->nCell;
  assert( nCell==get2byte(&data[hdr+3]) );
  usableSize = pPage->pBt->usableSize;
  cbrk = usableSize;
  iCellFirst = cellOffset + 2*nCell;
  iCellLast = usableSize - 4;
  for(i=0; i<nCell; i++){
    u8 *pAddr;     /* The i-th cell pointer */
    pAddr = &data[cellOffset + i*2];
    pc = get2byte(pAddr);
    testcase( pc==iCellFirst );
    testcase( pc==iCellLast );
#if !defined(SQLITE_ENABLE_OVERSIZE_CELL_CHECK)
    /* These conditions have already been verified in btreeInitPage()
    ** if SQLITE_ENABLE_OVERSIZE_CELL_CHECK is defined 
    */
    if( pc<iCellFirst || pc>iCellLast ){
      return SQLITE_CORRUPT_BKPT;
    }
#endif
    assert( pc>=iCellFirst && pc<=iCellLast );
    size = cellSizePtr(pPage, &src[pc]);
    cbrk -= size;
#if defined(SQLITE_ENABLE_OVERSIZE_CELL_CHECK)
    if( cbrk<iCellFirst ){
      return SQLITE_CORRUPT_BKPT;
    }
#else
    if( cbrk<iCellFirst || pc+size>usableSize ){
      return SQLITE_CORRUPT_BKPT;
    }
#endif
    assert( cbrk+size<=usableSize && cbrk>=iCellFirst );
    testcase( cbrk+size==usableSize );
    testcase( pc+size==usableSize );
    put2byte(pAddr, cbrk);
    if( temp==0 ){
      int x;
      if( cbrk==pc ) continue;
      temp = sqlite3PagerTempSpace(pPage->pBt->pPager);
      x = get2byte(&data[hdr+5]);
      memcpy(&temp[x], &data[x], (cbrk+size) - x);
      src = temp;
    }
    memcpy(&data[cbrk], &src[pc], size);
  }
  assert( cbrk>=iCellFirst );
  put2byte(&data[hdr+5], cbrk);
  data[hdr+1] = 0;
  data[hdr+2] = 0;
  data[hdr+7] = 0;
  memset(&data[iCellFirst], 0, cbrk-iCellFirst);
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  if( cbrk-iCellFirst!=pPage->nFree ){
    return SQLITE_CORRUPT_BKPT;
  }
  return SQLITE_OK;
}